

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deInt32.h
# Opt level: O0

deBool deIsPowerOfTwoSize(size_t a)

{
  deBool dVar1;
  size_t a_local;
  
  dVar1 = deIsPowerOfTwo64(a);
  return dVar1;
}

Assistant:

DE_INLINE deBool deIsPowerOfTwoSize (size_t a)
{
#if (DE_PTR_SIZE == 4)
	return deIsPowerOfTwo32(a);
#elif (DE_PTR_SIZE == 8)
	return deIsPowerOfTwo64(a);
#else
#	error "Invalid DE_PTR_SIZE"
#endif
}